

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-arithm.cpp
# Opt level: O2

void test_abs<double>(uint length)

{
  double dVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  undefined4 uVar12;
  undefined8 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined4 uVar18;
  int iVar19;
  double *pdVar20;
  long lVar21;
  ulong uVar22;
  undefined8 *puVar23;
  uint uVar24;
  double *pdVar25;
  ulong uVar26;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var27;
  double *local_c8;
  shared_ptr<double> pv;
  
  pdVar20 = nosimd::common::malloc<double>(length);
  std::__shared_ptr<double,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<double,void(*)(double*),void>
            ((__shared_ptr<double,(__gnu_cxx::_Lock_policy)2> *)&local_c8,pdVar20,
             nosimd::common::free<double>);
  lVar21 = 0;
  uVar26 = 0;
  pdVar20 = local_c8;
  if (0 < (int)length) {
    uVar26 = (ulong)length;
  }
  for (; pdVar25 = local_c8, uVar24 = length, -lVar21 != uVar26; lVar21 = lVar21 + -1) {
    *pdVar20 = (double)(int)lVar21;
    pdVar20 = pdVar20 + 1;
  }
  for (; 7 < (int)uVar24; uVar24 = uVar24 - 8) {
    uVar3 = *(uint *)pdVar25;
    uVar4 = *(uint *)((long)pdVar25 + 4);
    uVar5 = *(uint *)(pdVar25 + 1);
    uVar6 = *(uint *)((long)pdVar25 + 0xc);
    dVar1 = pdVar25[2];
    dVar7 = pdVar25[3];
    dVar8 = pdVar25[4];
    dVar9 = pdVar25[5];
    dVar10 = pdVar25[6];
    dVar11 = pdVar25[7];
    if ((sse::internals::abs_pd(double(int))::sign_mask == '\0') &&
       (iVar19 = __cxa_guard_acquire(&sse::internals::abs_pd(double(int))::sign_mask), iVar19 != 0))
    {
      sse::internals::abs_pd(double(int))::sign_mask._0_8_ = 0x8000000000000000;
      sse::internals::abs_pd(double(int))::sign_mask._8_8_ = 0x8000000000000000;
      __cxa_guard_release(&sse::internals::abs_pd(double(int))::sign_mask);
    }
    uVar12 = sse::internals::abs_pd(double(int))::sign_mask._0_4_;
    uVar14 = sse::internals::abs_pd(double(int))::sign_mask._4_4_;
    uVar15 = sse::internals::abs_pd(double(int))::sign_mask._8_4_;
    uVar18 = sse::internals::abs_pd(double(int))::sign_mask._12_4_;
    if ((sse::internals::abs_pd(double(int))::sign_mask == '\0') &&
       (iVar19 = __cxa_guard_acquire(&sse::internals::abs_pd(double(int))::sign_mask), iVar19 != 0))
    {
      sse::internals::abs_pd(double(int))::sign_mask._0_8_ = 0x8000000000000000;
      sse::internals::abs_pd(double(int))::sign_mask._8_8_ = 0x8000000000000000;
      __cxa_guard_release(&sse::internals::abs_pd(double(int))::sign_mask);
    }
    uVar16 = sse::internals::abs_pd(double(int))::sign_mask._8_8_;
    uVar13 = sse::internals::abs_pd(double(int))::sign_mask._0_8_;
    if ((sse::internals::abs_pd(double(int))::sign_mask == '\0') &&
       (iVar19 = __cxa_guard_acquire(&sse::internals::abs_pd(double(int))::sign_mask), iVar19 != 0))
    {
      sse::internals::abs_pd(double(int))::sign_mask._0_8_ = 0x8000000000000000;
      sse::internals::abs_pd(double(int))::sign_mask._8_8_ = 0x8000000000000000;
      __cxa_guard_release(&sse::internals::abs_pd(double(int))::sign_mask);
    }
    uVar17 = sse::internals::abs_pd(double(int))::sign_mask._8_8_;
    _Var27._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   sse::internals::abs_pd(double(int))::sign_mask._0_8_;
    if (sse::internals::abs_pd(double(int))::sign_mask == '\0') {
      pv.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           sse::internals::abs_pd(double(int))::sign_mask._0_8_;
      iVar19 = __cxa_guard_acquire(&sse::internals::abs_pd(double(int))::sign_mask);
      _Var27 = pv.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      if (iVar19 != 0) {
        sse::internals::abs_pd(double(int))::sign_mask._0_8_ = 0x8000000000000000;
        sse::internals::abs_pd(double(int))::sign_mask._8_8_ = 0x8000000000000000;
        __cxa_guard_release(&sse::internals::abs_pd(double(int))::sign_mask);
        _Var27 = pv.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      }
    }
    uVar22 = ~sse::internals::abs_pd(double(int))::sign_mask._0_8_;
    uVar2 = ~sse::internals::abs_pd(double(int))::sign_mask._8_8_;
    *(uint *)pdVar25 = ~uVar12 & uVar3;
    *(uint *)((long)pdVar25 + 4) = ~uVar14 & uVar4;
    *(uint *)(pdVar25 + 1) = ~uVar15 & uVar5;
    *(uint *)((long)pdVar25 + 0xc) = ~uVar18 & uVar6;
    pdVar25[2] = (double)(~uVar13 & (ulong)dVar1);
    pdVar25[3] = (double)(~uVar16 & (ulong)dVar7);
    pdVar25[4] = (double)(~(ulong)_Var27._M_pi & (ulong)dVar8);
    pdVar25[5] = (double)(~uVar17 & (ulong)dVar9);
    pdVar25[6] = (double)(uVar22 & (ulong)dVar10);
    pdVar25[7] = (double)(uVar2 & (ulong)dVar11);
    pdVar25 = pdVar25 + 8;
  }
  for (; 3 < (int)uVar24; uVar24 = uVar24 - 4) {
    dVar1 = *pdVar25;
    dVar7 = pdVar25[1];
    dVar8 = pdVar25[2];
    dVar9 = pdVar25[3];
    if ((sse::internals::abs_pd(double(int))::sign_mask == '\0') &&
       (iVar19 = __cxa_guard_acquire(&sse::internals::abs_pd(double(int))::sign_mask), iVar19 != 0))
    {
      sse::internals::abs_pd(double(int))::sign_mask._0_8_ = 0x8000000000000000;
      sse::internals::abs_pd(double(int))::sign_mask._8_8_ = 0x8000000000000000;
      __cxa_guard_release(&sse::internals::abs_pd(double(int))::sign_mask);
    }
    uVar16 = sse::internals::abs_pd(double(int))::sign_mask._8_8_;
    uVar13 = sse::internals::abs_pd(double(int))::sign_mask._0_8_;
    if ((sse::internals::abs_pd(double(int))::sign_mask == '\0') &&
       (iVar19 = __cxa_guard_acquire(&sse::internals::abs_pd(double(int))::sign_mask), iVar19 != 0))
    {
      sse::internals::abs_pd(double(int))::sign_mask._0_8_ = 0x8000000000000000;
      sse::internals::abs_pd(double(int))::sign_mask._8_8_ = 0x8000000000000000;
      __cxa_guard_release(&sse::internals::abs_pd(double(int))::sign_mask);
    }
    uVar22 = ~sse::internals::abs_pd(double(int))::sign_mask._0_8_;
    uVar2 = ~sse::internals::abs_pd(double(int))::sign_mask._8_8_;
    *pdVar25 = (double)(~uVar13 & (ulong)dVar1);
    pdVar25[1] = (double)(~uVar16 & (ulong)dVar7);
    pdVar25[2] = (double)(uVar22 & (ulong)dVar8);
    pdVar25[3] = (double)(uVar2 & (ulong)dVar9);
    pdVar25 = pdVar25 + 4;
  }
  if (1 < (int)uVar24) {
    dVar1 = *pdVar25;
    dVar7 = pdVar25[1];
    if ((sse::internals::abs_pd(double(int))::sign_mask == '\0') &&
       (iVar19 = __cxa_guard_acquire(&sse::internals::abs_pd(double(int))::sign_mask), iVar19 != 0))
    {
      sse::internals::abs_pd(double(int))::sign_mask._0_8_ = 0x8000000000000000;
      sse::internals::abs_pd(double(int))::sign_mask._8_8_ = 0x8000000000000000;
      __cxa_guard_release(&sse::internals::abs_pd(double(int))::sign_mask);
    }
    uVar22 = ~sse::internals::abs_pd(double(int))::sign_mask._8_8_;
    *pdVar25 = (double)(~sse::internals::abs_pd(double(int))::sign_mask._0_8_ & (ulong)dVar1);
    pdVar25[1] = (double)(uVar22 & (ulong)dVar7);
    uVar24 = uVar24 - 2;
    pdVar25 = pdVar25 + 2;
  }
  if (uVar24 != 0) {
    dVar1 = *pdVar25;
    if ((sse::internals::abs_pd(double(int))::sign_mask == '\0') &&
       (iVar19 = __cxa_guard_acquire(&sse::internals::abs_pd(double(int))::sign_mask), iVar19 != 0))
    {
      sse::internals::abs_pd(double(int))::sign_mask._0_8_ = 0x8000000000000000;
      sse::internals::abs_pd(double(int))::sign_mask._8_8_ = 0x8000000000000000;
      __cxa_guard_release(&sse::internals::abs_pd(double(int))::sign_mask);
    }
    *pdVar25 = (double)(~sse::internals::abs_pd(double(int))::sign_mask._0_8_ & (ulong)dVar1);
  }
  uVar22 = 0;
  do {
    if (uVar26 == uVar22) {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pv);
      return;
    }
    dVar1 = local_c8[uVar22];
    uVar22 = uVar22 + 1;
  } while ((0.0 <= dVar1) || ((dVar1 == 2.2250738585072014e-308 && (!NAN(dVar1)))));
  puVar23 = (undefined8 *)__cxa_allocate_exception(0x10);
  *puVar23 = "void test_abs(unsigned int) [T = double]";
  *(undefined4 *)(puVar23 + 1) = 0x81;
  *(uint *)((long)puVar23 + 0xc) = length;
  __cxa_throw(puVar23,&Exception::typeinfo,0);
}

Assistant:

void test_abs(unsigned length = 47)
{
    auto pv = std::shared_ptr<T>(simd::malloc<T>(length), simd::free<T>);
    T * v = pv.get();

    for (int i = 0; i < (int)length; ++i)
        v[i] = -i;

    simd::abs(v, v, length);

    for (int i = 0; i < (int)length; ++i)
    {
        if (v[i] < 0 && v[i] != std::numeric_limits<T>::min())
            FAIL();
    }
}